

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O3

REF_STATUS
ref_gather_scalar_surf_tec
          (REF_GRID ref_grid,REF_INT ldim,REF_DBL *scalar,char **scalar_names,char *filename)

{
  int iVar1;
  REF_CELL pRVar2;
  bool bVar3;
  uint uVar4;
  FILE *__s;
  undefined8 uVar5;
  char *pcVar6;
  uint cell_id;
  ulong uVar7;
  REF_NODE pRVar8;
  REF_GLOB *l2c;
  REF_GLOB nnode;
  REF_LONG ncell;
  REF_INT max_faceid;
  REF_INT min_faceid;
  REF_GLOB *local_68;
  long local_60;
  long local_58;
  int local_4c;
  REF_NODE local_48;
  uint local_3c;
  REF_DBL *local_38;
  
  local_38 = scalar;
  if (ref_grid->mpi->id == 0) {
    local_48 = ref_grid->node;
    __s = fopen(filename,"w");
    if (__s == (FILE *)0x0) {
      printf("unable to open %s\n",filename);
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0xdda,"ref_gather_scalar_surf_tec","unable to open file");
      return 2;
    }
    fwrite("title=\"tecplot refine gather\"\n",0x1e,1,__s);
    fwrite("variables = \"x\" \"y\" \"z\"",0x17,1,__s);
    if (scalar_names == (char **)0x0) {
      if (0 < ldim) {
        uVar4 = 1;
        do {
          fprintf(__s," \"V%d\"",(ulong)uVar4);
          iVar1 = (1 - ldim) + uVar4;
          uVar4 = uVar4 + 1;
        } while (iVar1 != 1);
      }
    }
    else if (0 < ldim) {
      uVar7 = 0;
      do {
        fprintf(__s," \"%s\"",scalar_names[uVar7]);
        uVar7 = uVar7 + 1;
      } while ((uint)ldim != uVar7);
    }
    fputc(10,__s);
    pRVar8 = local_48;
  }
  else {
    __s = (FILE *)0x0;
    pRVar8 = ref_grid->node;
  }
  uVar4 = ref_node_synchronize_globals(pRVar8);
  if (uVar4 == 0) {
    local_48 = pRVar8;
    uVar4 = ref_grid_faceid_range(ref_grid,(REF_INT *)&local_3c,&local_4c);
    if (uVar4 == 0) {
      cell_id = local_3c;
      if ((int)local_3c <= local_4c) {
        do {
          pRVar2 = ref_grid->cell[3];
          uVar4 = ref_grid_compact_cell_id_nodes
                            (ref_grid,pRVar2,cell_id,&local_60,&local_58,&local_68);
          if (uVar4 != 0) {
            pcVar6 = "l2c";
            uVar5 = 0xded;
            goto LAB_0012ba3c;
          }
          if (0 < local_58 && 0 < local_60) {
            if (ref_grid->mpi->id == 0) {
              fprintf(__s,"zone t=\"tri%d\", nodes=%ld, elements=%ld, datapacking=%s, zonetype=%s\n"
                      ,(ulong)cell_id,local_60,local_58,"point","fetriangle");
            }
            pRVar8 = local_48;
            uVar4 = ref_gather_node_tec_part(local_48,local_60,local_68,ldim,local_38,(FILE *)__s);
            if (uVar4 != 0) {
              pcVar6 = "nodes";
              uVar5 = 0xdf7;
              goto LAB_0012ba3c;
            }
            uVar4 = ref_gather_cell_id_tec(pRVar8,pRVar2,cell_id,local_58,local_68,0,(FILE *)__s);
            if (uVar4 != 0) {
              pcVar6 = "t";
              uVar5 = 0xdfa;
              goto LAB_0012ba3c;
            }
          }
          if (local_68 != (REF_GLOB *)0x0) {
            free(local_68);
          }
          pRVar2 = ref_grid->cell[6];
          uVar4 = ref_grid_compact_cell_id_nodes
                            (ref_grid,pRVar2,cell_id,&local_60,&local_58,&local_68);
          if (uVar4 != 0) {
            pcVar6 = "l2c";
            uVar5 = 0xe01;
            goto LAB_0012ba3c;
          }
          if (0 < local_58 && 0 < local_60) {
            if (ref_grid->mpi->id == 0) {
              fprintf(__s,
                      "zone t=\"quad%d\", nodes=%ld, elements=%ld, datapacking=%s, zonetype=%s\n",
                      (ulong)cell_id,local_60,local_58,"point","fequadrilateral");
            }
            pRVar8 = local_48;
            uVar4 = ref_gather_node_tec_part(local_48,local_60,local_68,ldim,local_38,(FILE *)__s);
            if (uVar4 != 0) {
              pcVar6 = "nodes";
              uVar5 = 0xe0b;
              goto LAB_0012ba3c;
            }
            uVar4 = ref_gather_cell_id_tec(pRVar8,pRVar2,cell_id,local_58,local_68,0,(FILE *)__s);
            if (uVar4 != 0) {
              pcVar6 = "t";
              uVar5 = 0xe0e;
              goto LAB_0012ba3c;
            }
          }
          if (local_68 != (REF_GLOB *)0x0) {
            free(local_68);
          }
          bVar3 = (int)cell_id < local_4c;
          cell_id = cell_id + 1;
        } while (bVar3);
      }
      if (ref_grid->mpi->id != 0) {
        return 0;
      }
      fclose(__s);
      return 0;
    }
    pcVar6 = "range";
    uVar5 = 0xde7;
  }
  else {
    pcVar6 = "sync";
    uVar5 = 0xde5;
  }
LAB_0012ba3c:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar5,
         "ref_gather_scalar_surf_tec",(ulong)uVar4,pcVar6);
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_gather_scalar_surf_tec(REF_GRID ref_grid, REF_INT ldim,
                                              REF_DBL *scalar,
                                              const char **scalar_names,
                                              const char *filename) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  FILE *file;
  REF_INT i;
  REF_GLOB nnode, *l2c;
  REF_LONG ncell;
  REF_INT min_faceid, max_faceid, cell_id;
  file = NULL;
  if (ref_grid_once(ref_grid)) {
    file = fopen(filename, "w");
    if (NULL == (void *)file) printf("unable to open %s\n", filename);
    RNS(file, "unable to open file");
    fprintf(file, "title=\"tecplot refine gather\"\n");
    fprintf(file, "variables = \"x\" \"y\" \"z\"");
    if (NULL != scalar_names) {
      for (i = 0; i < ldim; i++) fprintf(file, " \"%s\"", scalar_names[i]);
    } else {
      for (i = 0; i < ldim; i++) fprintf(file, " \"V%d\"", i + 1);
    }
    fprintf(file, "\n");
  }

  RSS(ref_node_synchronize_globals(ref_node), "sync");

  RSS(ref_grid_faceid_range(ref_grid, &min_faceid, &max_faceid), "range");

  for (cell_id = min_faceid; cell_id <= max_faceid; cell_id++) {
    ref_cell = ref_grid_tri(ref_grid);
    RSS(ref_grid_compact_cell_id_nodes(ref_grid, ref_cell, cell_id, &nnode,
                                       &ncell, &l2c),
        "l2c");
    if (nnode > 0 && ncell > 0) {
      if (ref_grid_once(ref_grid)) {
        fprintf(file,
                "zone t=\"tri%d\", nodes=" REF_GLOB_FMT
                ", elements=%ld, datapacking=%s, "
                "zonetype=%s\n",
                cell_id, nnode, ncell, "point", "fetriangle");
      }
      RSS(ref_gather_node_tec_part(ref_node, nnode, l2c, ldim, scalar, file),
          "nodes");
      RSS(ref_gather_cell_id_tec(ref_node, ref_cell, cell_id, ncell, l2c,
                                 REF_FALSE, file),
          "t");
    }
    ref_free(l2c);

    ref_cell = ref_grid_qua(ref_grid);
    RSS(ref_grid_compact_cell_id_nodes(ref_grid, ref_cell, cell_id, &nnode,
                                       &ncell, &l2c),
        "l2c");
    if (nnode > 0 && ncell > 0) {
      if (ref_grid_once(ref_grid)) {
        fprintf(file,
                "zone t=\"quad%d\", nodes=" REF_GLOB_FMT
                ", elements=%ld, datapacking=%s, "
                "zonetype=%s\n",
                cell_id, nnode, ncell, "point", "fequadrilateral");
      }
      RSS(ref_gather_node_tec_part(ref_node, nnode, l2c, ldim, scalar, file),
          "nodes");
      RSS(ref_gather_cell_id_tec(ref_node, ref_cell, cell_id, ncell, l2c,
                                 REF_FALSE, file),
          "t");
    }
    ref_free(l2c);
  }

  if (ref_grid_once(ref_grid)) fclose(file);

  return REF_SUCCESS;
}